

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RegistryAccess.cpp
# Opt level: O1

ostream * __thiscall bhf::ads::RegistryEntry::Write(RegistryEntry *this,ostream *os)

{
  pointer __s;
  uint8_t *it;
  long lVar1;
  ostream oVar2;
  undefined8 in_RAX;
  mapped_type *pmVar3;
  ostream *poVar4;
  size_t sVar5;
  size_t sVar6;
  mapped_type *pmVar7;
  ulong uVar8;
  byte *pbVar9;
  long lVar10;
  ulong uVar11;
  undefined8 uStack_38;
  
  if (this->keyLen == 0) {
    it = (this->buffer).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
         super__Vector_impl_data._M_start;
    if (*it == '\0') {
      uStack_38._7_1_ = (undefined1)((ulong)in_RAX >> 0x38);
      uStack_38._0_6_ = (undefined6)in_RAX;
      uStack_38._0_7_ = CONCAT16(0x40,(undefined6)uStack_38);
      sVar6 = 1;
      std::__ostream_insert<char,std::char_traits<char>>(os,(char *)((long)&uStack_38 + 6),1);
    }
    else {
      uStack_38 = in_RAX;
      sVar6 = WriteEscaped(os,it,true);
    }
    pmVar7 = std::
             map<unsigned_int,_bhf::ads::DataMapping,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_bhf::ads::DataMapping>_>_>
             ::at((map<unsigned_int,_bhf::ads::DataMapping,_std::less<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_bhf::ads::DataMapping>_>_>
                   *)g_RegTypeMapping,&this->type);
    std::__ostream_insert<char,std::char_traits<char>>
              (os,(pmVar7->prefix)._M_dataplus._M_p,(pmVar7->prefix)._M_string_length);
    if (this->type == 4) {
      uVar11 = (long)(this->buffer).
                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                     super__Vector_impl_data._M_finish -
               (long)(this->buffer).
                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                     super__Vector_impl_data._M_start;
      if (3 < uVar11) {
        uVar8 = uVar11 - 4;
        do {
          uVar8 = uVar8 + 1;
        } while (uVar8 < uVar11);
      }
      lVar1 = *(long *)os;
      *(uint *)(os + *(long *)(lVar1 + -0x18) + 0x18) =
           *(uint *)(os + *(long *)(lVar1 + -0x18) + 0x18) & 0xffffffb5 | 8;
      *(undefined8 *)(os + *(long *)(lVar1 + -0x18) + 0x10) = 8;
      poVar4 = os + *(long *)(lVar1 + -0x18);
      if (os[*(long *)(lVar1 + -0x18) + 0xe1] == (ostream)0x0) {
        oVar2 = (ostream)std::ios::widen((char)poVar4);
        poVar4[0xe0] = oVar2;
        poVar4[0xe1] = (ostream)0x1;
      }
      poVar4[0xe0] = (ostream)0x30;
      std::ostream::_M_insert<unsigned_long>((ulong)os);
    }
    else if (this->type == 1) {
      WriteEscaped(os,(this->buffer).
                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                      super__Vector_impl_data._M_finish + -this->dataLen,false);
    }
    else if (this->dataLen != 0) {
      pbVar9 = (this->buffer).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
               _M_impl.super__Vector_impl_data._M_finish + -this->dataLen;
      lVar1 = *(long *)os;
      lVar10 = sVar6 + (pmVar7->prefix)._M_string_length;
      *(uint *)(os + *(long *)(lVar1 + -0x18) + 0x18) =
           *(uint *)(os + *(long *)(lVar1 + -0x18) + 0x18) & 0xffffffb5 | 8;
      *(undefined8 *)(os + *(long *)(lVar1 + -0x18) + 0x10) = 2;
      poVar4 = os + *(long *)(lVar1 + -0x18);
      if (os[*(long *)(lVar1 + -0x18) + 0xe1] == (ostream)0x0) {
        oVar2 = (ostream)std::ios::widen((char)poVar4);
        poVar4[0xe0] = oVar2;
        poVar4[0xe1] = (ostream)0x1;
      }
      poVar4[0xe0] = (ostream)0x30;
      std::ostream::operator<<(os,(uint)*pbVar9);
      pbVar9 = pbVar9 + 1;
      if (pbVar9 != (this->buffer).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                    ._M_impl.super__Vector_impl_data._M_finish) {
        do {
          uStack_38._0_6_ = CONCAT15(0x2c,(undefined5)uStack_38);
          std::__ostream_insert<char,std::char_traits<char>>(os,(char *)((long)&uStack_38 + 5),1);
          uVar11 = lVar10 + 1;
          if (0x4b < uVar11) {
            std::__ostream_insert<char,std::char_traits<char>>(os,"\\\n  ",4);
            uVar11 = 2;
          }
          lVar1 = *(long *)os;
          *(uint *)(os + *(long *)(lVar1 + -0x18) + 0x18) =
               *(uint *)(os + *(long *)(lVar1 + -0x18) + 0x18) & 0xffffffb5 | 8;
          *(undefined8 *)(os + *(long *)(lVar1 + -0x18) + 0x10) = 2;
          poVar4 = os + *(long *)(lVar1 + -0x18);
          if (os[*(long *)(lVar1 + -0x18) + 0xe1] == (ostream)0x0) {
            oVar2 = (ostream)std::ios::widen((char)poVar4);
            poVar4[0xe0] = oVar2;
            poVar4[0xe1] = (ostream)0x1;
          }
          poVar4[0xe0] = (ostream)0x30;
          std::ostream::operator<<(os,(uint)*pbVar9);
          lVar10 = uVar11 + 2;
          pbVar9 = pbVar9 + 1;
        } while (pbVar9 != (this->buffer).
                           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                           .super__Vector_impl_data._M_finish);
      }
    }
    uStack_38 = CONCAT17(10,(undefined7)uStack_38);
    poVar4 = std::__ostream_insert<char,std::char_traits<char>>(os,(char *)((long)&uStack_38 + 7),1)
    ;
  }
  else {
    std::__ostream_insert<char,std::char_traits<char>>(os,"\n[",2);
    pmVar3 = std::
             map<bhf::ads::nRegHive,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<bhf::ads::nRegHive>,_std::allocator<std::pair<const_bhf::ads::nRegHive,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::at((map<bhf::ads::nRegHive,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<bhf::ads::nRegHive>,_std::allocator<std::pair<const_bhf::ads::nRegHive,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   *)g_HiveMapping_abi_cxx11_,&this->hive);
    poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                       (os,(pmVar3->_M_dataplus)._M_p,pmVar3->_M_string_length);
    __s = (this->buffer).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_start;
    if (__s == (pointer)0x0) {
      std::ios::clear((int)poVar4 + (int)*(undefined8 *)(*(long *)poVar4 + -0x18));
    }
    else {
      sVar5 = strlen((char *)__s);
      std::__ostream_insert<char,std::char_traits<char>>(poVar4,(char *)__s,sVar5);
    }
    std::__ostream_insert<char,std::char_traits<char>>(poVar4,"]\n",2);
  }
  return poVar4;
}

Assistant:

std::ostream& RegistryEntry::Write(std::ostream& os) const
{
    if (keyLen) {
        // RegistryEntry is a registry key, which has no value and is placed in brackets in its own line
        return os << "\n[" << g_HiveMapping.at(hive) << reinterpret_cast<const char*>(buffer.data()) << "]\n";
    }

    size_t currentPos = 0;
    if (!buffer[0]) {
        // RegistryEntry is an anonymous registry value
        os << '@';
        currentPos += 1;
    } else {
        // RegistryEntry is a named registry value
        currentPos += WriteEscaped(os, buffer.data());
    }

    // Now, the actual data follows. First we write the data prefix
    const auto& prefix = g_RegTypeMapping.at(type).prefix;
    os << prefix;
    currentPos += prefix.length();

    // The actual data format depends on the type
    if (type == REG_SZ) {
        const auto dataBegin = buffer.data() + buffer.size() - dataLen;
        WriteEscaped(os, dataBegin, false);
    } else if (type == REG_DWORD) {
        uint32_t val = 0;
        for (size_t i = buffer.size() - sizeof(uint32_t); i < buffer.size(); ++i) {
            val <<= 8;
            val += buffer[i];
        }
        os << std::hex << std::setw(8) << std::setfill('0') << val;
    } else {
        if (dataLen > 0) {
            // Windows always exports 25 pairs of hex bytes (delimited by a comma) on each line
            // including two characters at the start so we do the same.
            constexpr auto lineWrap = 25 * 3 + 1;
            auto dataIt = std::prev(buffer.cend(), dataLen);
            os << std::hex << std::setw(2) << std::setfill('0') << +*dataIt++;
            for ( ; dataIt != buffer.cend(); dataIt++) {
                os << ',';
                currentPos++;
                if (currentPos >= lineWrap) {
                    os << "\\\n  ";
                    currentPos = 2;
                }
                os << std::hex << std::setw(2) << std::setfill('0') << +*dataIt;
                currentPos += 2;
            }
        }
    }
    return os << '\n';
}